

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_header_table.cpp
# Opt level: O3

bool __thiscall BmsHeaderTable::Query(BmsHeaderTable *this,string *key,double *v)

{
  _Rb_tree_header *p_Var1;
  const_iterator cVar2;
  BmsHeader *pBVar3;
  double dVar4;
  
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BmsHeader>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BmsHeader>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BmsHeader>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BmsHeader>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BmsHeader>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BmsHeader>_>_>
                  *)this,key);
  p_Var1 = &(this->table_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar2._M_node != p_Var1) {
    pBVar3 = operator[](this,key);
    dVar4 = atof((pBVar3->value)._M_dataplus._M_p);
    *v = dVar4;
  }
  return (_Rb_tree_header *)cVar2._M_node != p_Var1;
}

Assistant:

bool
BmsHeaderTable::Query(const std::string& key, double* v)
{
	if (IsExists(key)) {
		*v = this->operator[](key).ToFloat();
		return true;
	}
	return false;
}